

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O0

string * __thiscall RatioSequence::toString_abi_cxx11_(RatioSequence *this)

{
  size_type sVar1;
  ostream *poVar2;
  long in_RSI;
  string *in_RDI;
  Ratio *in_stack_00000048;
  size_t i;
  ostringstream ss;
  vector<Ratio,_std::allocator<Ratio>_> *this_00;
  string local_1e0 [48];
  string local_1b0 [32];
  vector<Ratio,_std::allocator<Ratio>_> *local_190;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_190 = (vector<Ratio,_std::allocator<Ratio>_> *)0x0;
  while( true ) {
    this_00 = local_190;
    sVar1 = std::vector<Ratio,_std::allocator<Ratio>_>::size
                      ((vector<Ratio,_std::allocator<Ratio>_> *)(in_RSI + 8));
    if ((vector<Ratio,_std::allocator<Ratio>_> *)(sVar1 - 1) <= this_00) break;
    std::vector<Ratio,_std::allocator<Ratio>_>::operator[]
              ((vector<Ratio,_std::allocator<Ratio>_> *)(in_RSI + 8),(size_type)local_190);
    Ratio::toString_abi_cxx11_(in_stack_00000048);
    poVar2 = std::operator<<((ostream *)local_188,local_1b0);
    std::operator<<(poVar2," ");
    std::__cxx11::string::~string(local_1b0);
    local_190 = (vector<Ratio,_std::allocator<Ratio>_> *)
                ((long)&(local_190->super__Vector_base<Ratio,_std::allocator<Ratio>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
  }
  std::vector<Ratio,_std::allocator<Ratio>_>::back(this_00);
  Ratio::toString_abi_cxx11_(in_stack_00000048);
  std::operator<<((ostream *)local_188,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

string RatioSequence::toString() {
    ostringstream ss;
    for (size_t i = 0; i < _RatioSequence.size() - 1; ++i) {
        ss << _RatioSequence[i].toString() << " ";
    }
    ss << _RatioSequence.back().toString();
    return ss.str();
}